

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::parseArgs(Context *this,int argc,char **argv,bool withDefaults)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ContextState *pCVar4;
  int intRes;
  String local_70;
  String strRes;
  String local_40;
  
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-source-file=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-sf=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-source-file-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-sfe=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-test-suite=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-ts=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-test-suite-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-tse=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-test-case=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-tc=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-test-case-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-tce=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-subcase=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-sc=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-subcase-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 7);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-sce=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 7);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-reporters=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8);
  anon_unknown_14::parseCommaSepArgs
            (argc,argv,"dt-r=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8);
  intRes = 0;
  strRes.field_0.buf[0] = '\0';
  strRes.field_0.buf[0x17] = '\x17';
  String::String(&local_70,"");
  bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-out=",&strRes,&local_70);
  if (bVar1) {
    String::~String(&local_70);
LAB_0010994b:
    String::operator=(&(this->p->super_ContextOptions).out,&strRes);
  }
  else {
    String::String(&local_40,"");
    bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-o=",&strRes,&local_40);
    String::~String(&local_40);
    String::~String(&local_70);
    if (bVar1 || withDefaults) goto LAB_0010994b;
  }
  String::String(&local_70,"file");
  bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-order-by=",&strRes,&local_70);
  if (bVar1) {
    String::~String(&local_70);
LAB_001099e3:
    String::operator=(&(this->p->super_ContextOptions).order_by,&strRes);
  }
  else {
    String::String(&local_40,"file");
    bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-ob=",&strRes,&local_40);
    String::~String(&local_40);
    String::~String(&local_70);
    if (bVar1 || withDefaults) goto LAB_001099e3;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-rand-seed=",option_int,&intRes);
  uVar2 = intRes;
  if (((bVar1) ||
      (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-rs=",option_int,&intRes),
      uVar2 = intRes, bVar1)) || (uVar2 = 0, withDefaults)) {
    (this->p->super_ContextOptions).rand_seed = uVar2;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-first=",option_int,&intRes);
  uVar2 = intRes;
  if (((bVar1) ||
      (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-f=",option_int,&intRes), uVar2 = intRes
      , bVar1)) || (uVar2 = 0, withDefaults)) {
    (this->p->super_ContextOptions).first = uVar2;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-last=",option_int,&intRes);
  uVar2 = intRes;
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-l=",option_int,&intRes), uVar2 = intRes,
     bVar1)) {
LAB_00109ac6:
    (this->p->super_ContextOptions).last = uVar2;
  }
  else if (withDefaults) {
    uVar2 = 0xffffffff;
    goto LAB_00109ac6;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-abort-after=",option_int,&intRes);
  iVar3 = intRes;
  if (((bVar1) ||
      (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-aa=",option_int,&intRes),
      iVar3 = intRes, bVar1)) || (iVar3 = 0, withDefaults)) {
    (this->p->super_ContextOptions).abort_after = iVar3;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-subcase-filter-levels=",option_int,&intRes);
  iVar3 = intRes;
  if (((bVar1) ||
      (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-scfl=",option_int,&intRes),
      iVar3 = intRes, bVar1)) || (iVar3 = 0x7fffffff, withDefaults)) {
    (this->p->super_ContextOptions).subcase_filter_levels = iVar3;
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-success=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-s=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).success = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-success");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-s"), bVar1)) {
      (this->p->super_ContextOptions).success = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).success = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-case-sensitive=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-cs=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).case_sensitive = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-case-sensitive");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-cs"), bVar1)) {
      (this->p->super_ContextOptions).case_sensitive = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).case_sensitive = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-exit=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-e=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).exit = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-exit");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-e"), bVar1)) {
      (this->p->super_ContextOptions).exit = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).exit = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-duration=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-d=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).duration = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-duration");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-d"), bVar1)) {
      (this->p->super_ContextOptions).duration = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).duration = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-minimal=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-m=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).minimal = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-minimal");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-m"), bVar1)) {
      (this->p->super_ContextOptions).minimal = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).minimal = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-quiet=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-q=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).quiet = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-quiet");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-q"), bVar1)) {
      (this->p->super_ContextOptions).quiet = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).quiet = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-throw=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nt=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_throw = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-throw");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nt"), bVar1)) {
      (this->p->super_ContextOptions).no_throw = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_throw = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-exitcode=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-ne=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_exitcode = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-exitcode");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ne"), bVar1)) {
      (this->p->super_ContextOptions).no_exitcode = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_exitcode = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-run=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nr=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_run = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-run");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nr"), bVar1)) {
      (this->p->super_ContextOptions).no_run = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_run = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-intro=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-ni=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_intro = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-intro");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ni"), bVar1)) {
      (this->p->super_ContextOptions).no_intro = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_intro = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-version=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nv=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_version = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-version");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nv"), bVar1)) {
      (this->p->super_ContextOptions).no_version = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_version = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-colors=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nc=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_colors = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-colors");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nc"), bVar1)) {
      (this->p->super_ContextOptions).no_colors = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_colors = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-force-colors=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-fc=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).force_colors = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-force-colors");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-fc"), bVar1)) {
      (this->p->super_ContextOptions).force_colors = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).force_colors = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-breaks=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nb=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_breaks = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-breaks");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nb"), bVar1)) {
      (this->p->super_ContextOptions).no_breaks = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_breaks = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-skip=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-ns=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_skip = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-skip");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ns"), bVar1)) {
      (this->p->super_ContextOptions).no_skip = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_skip = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-gnu-file-line=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-gfl=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).gnu_file_line = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-gnu-file-line");
    if (((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-gfl"), bVar1)) ||
       (withDefaults)) {
      (this->p->super_ContextOptions).gnu_file_line = true;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-path-filenames=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-npf=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_path_in_filenames = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-path-filenames");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-npf"), bVar1)) {
      (this->p->super_ContextOptions).no_path_in_filenames = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_path_in_filenames = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-line-numbers=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nln=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_line_numbers = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-line-numbers");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nln"), bVar1)) {
      (this->p->super_ContextOptions).no_line_numbers = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_line_numbers = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-debug-output=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-ndo=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_debug_output = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-debug-output");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ndo"), bVar1)) {
      (this->p->super_ContextOptions).no_debug_output = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_debug_output = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-skipped-summary=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-nss=",option_bool,&intRes), bVar1)) {
    (this->p->super_ContextOptions).no_skipped_summary = intRes != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-skipped-summary");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nss"), bVar1)) {
      (this->p->super_ContextOptions).no_skipped_summary = true;
    }
    else if (withDefaults) {
      (this->p->super_ContextOptions).no_skipped_summary = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-no-time-in-output=",option_bool,&intRes);
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption(argc,argv,"dt-ntio=",option_bool,&intRes), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).no_time_in_output = intRes != 0;
LAB_0010a53c:
    if (!withDefaults) goto LAB_0010a550;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-time-in-output");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ntio"), bVar1)) {
      pCVar4 = this->p;
      (pCVar4->super_ContextOptions).no_time_in_output = true;
      goto LAB_0010a53c;
    }
    if (!withDefaults) goto LAB_0010a550;
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).no_time_in_output = false;
  }
  (pCVar4->super_ContextOptions).list_test_suites = false;
  (pCVar4->super_ContextOptions).list_reporters = false;
  (pCVar4->super_ContextOptions).help = false;
  (pCVar4->super_ContextOptions).version = false;
  (pCVar4->super_ContextOptions).count = false;
  (pCVar4->super_ContextOptions).list_test_cases = false;
LAB_0010a550:
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-help");
  if (((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-h"), bVar1)) ||
     (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-?"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).help = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-version");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-v"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).version = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-count");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-c"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).count = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-test-cases");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ltc"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).list_test_cases = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-test-suites");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-lts"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).list_test_suites = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-reporters");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-lr"), bVar1)) {
    pCVar4 = this->p;
    (pCVar4->super_ContextOptions).list_reporters = true;
    (pCVar4->super_ContextOptions).exit = true;
  }
  String::~String(&strRes);
  return;
}

Assistant:

void Context::parseArgs(int argc, const char* const* argv, bool withDefaults) {
    using namespace detail;

    // clang-format off
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file=",        p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sf=",                 p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file-exclude=",p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sfe=",                p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite=",         p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ts=",                 p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite-exclude=", p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tse=",                p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case=",          p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tc=",                 p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case-exclude=",  p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tce=",                p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase=",            p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sc=",                 p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase-exclude=",    p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sce=",                p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "reporters=",          p->filters[8]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "r=",                  p->filters[8]);
    // clang-format on

    int    intRes = 0;
    String strRes;

#define DOCTEST_PARSE_AS_BOOL_OR_FLAG(name, sname, var, default)                                   \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_bool, intRes) ||  \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_bool, intRes))   \
        p->var = static_cast<bool>(intRes);                                                        \
    else if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name) ||                           \
            parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname))                            \
        p->var = true;                                                                             \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_INT_OPTION(name, sname, var, default)                                        \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_int, intRes) ||   \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_int, intRes))    \
        p->var = intRes;                                                                           \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_STR_OPTION(name, sname, var, default)                                        \
    if(parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", &strRes, default) ||        \
       parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", &strRes, default) ||       \
       withDefaults)                                                                               \
    p->var = strRes

    // clang-format off
    DOCTEST_PARSE_STR_OPTION("out", "o", out, "");
    DOCTEST_PARSE_STR_OPTION("order-by", "ob", order_by, "file");
    DOCTEST_PARSE_INT_OPTION("rand-seed", "rs", rand_seed, 0);

    DOCTEST_PARSE_INT_OPTION("first", "f", first, 0);
    DOCTEST_PARSE_INT_OPTION("last", "l", last, UINT_MAX);

    DOCTEST_PARSE_INT_OPTION("abort-after", "aa", abort_after, 0);
    DOCTEST_PARSE_INT_OPTION("subcase-filter-levels", "scfl", subcase_filter_levels, INT_MAX);

    DOCTEST_PARSE_AS_BOOL_OR_FLAG("success", "s", success, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("case-sensitive", "cs", case_sensitive, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("exit", "e", exit, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("duration", "d", duration, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("minimal", "m", minimal, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("quiet", "q", quiet, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-throw", "nt", no_throw, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-exitcode", "ne", no_exitcode, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-run", "nr", no_run, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-intro", "ni", no_intro, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-version", "nv", no_version, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-colors", "nc", no_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("force-colors", "fc", force_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-breaks", "nb", no_breaks, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skip", "ns", no_skip, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("gnu-file-line", "gfl", gnu_file_line, !bool(DOCTEST_MSVC));
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-path-filenames", "npf", no_path_in_filenames, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-line-numbers", "nln", no_line_numbers, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-debug-output", "ndo", no_debug_output, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skipped-summary", "nss", no_skipped_summary, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-time-in-output", "ntio", no_time_in_output, false);
    // clang-format on

    if(withDefaults) {
        p->help             = false;
        p->version          = false;
        p->count            = false;
        p->list_test_cases  = false;
        p->list_test_suites = false;
        p->list_reporters   = false;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "help") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "h") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "?")) {
        p->help = true;
        p->exit = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "version") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "v")) {
        p->version = true;
        p->exit    = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "count") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "c")) {
        p->count = true;
        p->exit  = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-cases") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ltc")) {
        p->list_test_cases = true;
        p->exit            = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-suites") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lts")) {
        p->list_test_suites = true;
        p->exit             = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-reporters") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lr")) {
        p->list_reporters = true;
        p->exit           = true;
    }
}